

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subcommand.c
# Opt level: O3

REF_STATUS
distance_metric_fill(REF_GRID_conflict ref_grid,REF_DICT ref_dict_bcs,int argc,char **argv)

{
  size_t sVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  int iVar9;
  REF_STATUS RVar10;
  REF_DICT distance;
  REF_DBL *pRVar11;
  REF_DBL *pRVar12;
  FILE *pFVar13;
  REF_NODE pRVar14;
  REF_DBL *pRVar15;
  undefined8 uVar16;
  char **ppcVar17;
  REF_MPI pRVar18;
  char *pcVar19;
  long lVar20;
  char cVar21;
  long lVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double dVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  double dVar33;
  int iVar34;
  REF_INT n_tab;
  REF_INT pos;
  REF_DBL h;
  REF_DBL h_1;
  char line [1024];
  uint local_520;
  char local_519;
  REF_DBL *local_518;
  REF_DBL *local_510;
  int local_504;
  REF_MPI local_500;
  REF_DBL *local_4f8;
  REF_DICT local_4f0;
  FILE *local_4e8;
  undefined8 local_4e0;
  double local_4d8;
  double local_4d0;
  uint local_4c4;
  REF_NODE local_4c0;
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  double local_498;
  undefined8 uStack_490;
  double local_488;
  undefined8 uStack_480;
  undefined1 local_478 [16];
  double local_468 [4];
  undefined8 local_448;
  double local_440;
  undefined1 local_438 [16];
  undefined8 local_428;
  char *local_420;
  char *pcStack_418;
  char *local_410;
  REF_DBL local_408 [3];
  REF_DBL local_3f0 [120];
  
  pRVar18 = ref_grid->mpi;
  pRVar14 = ref_grid->node;
  local_520 = 0;
  local_4f0 = ref_dict_bcs;
  uVar6 = ref_args_find(argc,argv,"--aspect-ratio",&local_504);
  if ((uVar6 != 0) && (uVar6 != 5)) {
    pcVar19 = "arg search";
    uVar16 = 0x1ac;
    goto LAB_0011fdd3;
  }
  iVar9 = argc + -1;
  local_500 = pRVar18;
  local_4c0 = pRVar14;
  if (local_504 < iVar9 && local_504 != -1) {
    dVar23 = atof(argv[(long)local_504 + 1]);
    local_478._0_8_ = 1.0;
    if (1.0 <= dVar23) {
      local_478._0_8_ = dVar23;
    }
    if (local_500->id == 0) {
      printf("limit --aspect-ratio to %f for --stepexp\n",local_478._0_8_);
    }
  }
  else {
    local_478._0_8_ = 0x3ff0000000000000;
  }
  uVar7 = ref_args_find(argc,argv,"--stepexp",&local_504);
  if ((uVar7 != 0) && (uVar7 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x1b5,"distance_metric_fill",(ulong)uVar7,"arg search");
    uVar6 = uVar7;
  }
  iVar5 = local_504;
  if ((uVar7 != 5) && (uVar7 != 0)) {
    return uVar6;
  }
  lVar20 = (long)local_504;
  if (lVar20 == -1) {
    uVar8 = 0;
    local_4d0 = 0.0;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_4b8._8_8_;
    local_4b8 = auVar3 << 0x40;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_4a8._8_8_;
    local_4a8 = auVar4 << 0x40;
    local_498 = 0.0;
    local_488 = 0.0;
    dVar23 = 0.0;
  }
  else {
    if (argc <= local_504 + 6) {
      pcVar19 = "not enough --stepexp args";
      uVar16 = 0x1b8;
      goto LAB_001205d6;
    }
    local_488 = atof(argv[lVar20 + 1]);
    local_498 = atof(argv[lVar20 + 2]);
    local_4a8._0_8_ = atof(argv[lVar20 + 3]);
    local_4b8._0_8_ = atof(argv[lVar20 + 4]);
    local_4d0 = atof(argv[lVar20 + 5]);
    dVar23 = atof(argv[lVar20 + 6]);
    if (local_500->id == 0) {
      local_4d8 = dVar23;
      printf("h0 %f h1 %f h2 %f s1 %f s2 %f width %f\n",local_488,local_498,local_4a8._0_8_,
             local_4b8._0_8_,local_4d0,dVar23);
      dVar23 = local_4d8;
    }
    if (local_488 <= 0.0) {
      pcVar19 = "positive h0";
      uVar16 = 0x1c2;
      goto LAB_001205d6;
    }
    if (local_498 <= 0.0) {
      pcVar19 = "positive h1";
      uVar16 = 0x1c3;
      goto LAB_001205d6;
    }
    if ((double)local_4a8._0_8_ <= 0.0) {
      pcVar19 = "positive h2";
      uVar16 = 0x1c4;
      goto LAB_001205d6;
    }
    if ((double)local_4b8._0_8_ <= 0.0) {
      pcVar19 = "positive s1";
      uVar16 = 0x1c5;
      goto LAB_001205d6;
    }
    if (local_4d0 <= 0.0) {
      pcVar19 = "positive s2";
      uVar16 = 0x1c6;
      goto LAB_001205d6;
    }
    uVar8 = 1;
    if (dVar23 <= 0.0) {
      pcVar19 = "positive width";
      uVar16 = 0x1c7;
      goto LAB_001205d6;
    }
  }
  local_4d8 = dVar23;
  local_4f8 = (REF_DBL *)CONCAT44(local_4f8._4_4_,uVar8);
  uVar7 = ref_args_find(argc,argv,"--spacing-table",&local_504);
  if ((uVar7 != 0) && (uVar7 != 5)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
           0x1cb,"distance_metric_fill",(ulong)uVar7,"metric arg search");
    uVar6 = uVar7;
  }
  if ((uVar7 != 5) && (uVar7 != 0)) {
    return uVar6;
  }
  cVar21 = iVar9 <= local_504 || local_504 == -1;
  if (iVar9 <= local_504 || local_504 == -1) {
    pRVar12 = (REF_DBL *)0x0;
    pRVar11 = (REF_DBL *)0x0;
    iVar9 = 0;
    pRVar15 = (REF_DBL *)0x0;
    pRVar18 = local_500;
  }
  else {
    if (local_500->id == 0) {
      pRVar12 = (REF_DBL *)argv[(long)local_504 + 1];
      pFVar13 = fopen((char *)pRVar12,"r");
      if (pFVar13 == (FILE *)0x0) {
        printf("unable to open %s\n",pRVar12);
        pcVar19 = "unable to open file";
        uVar16 = 0x1d6;
        goto LAB_00120682;
      }
      local_520 = 0;
      local_518 = pRVar12;
      pcVar19 = fgets(local_438,0x400,pFVar13);
      if (local_438 == pcVar19) {
        do {
          pcVar19 = strtok(local_438," ");
          if (pcVar19 != (char *)0x0) {
            iVar9 = 1;
            do {
              pcVar19 = strtok((char *)0x0," ");
              iVar9 = iVar9 + -1;
            } while (pcVar19 != (char *)0x0);
            if (iVar9 != 0) {
              local_520 = local_520 + 1;
            }
          }
          pcVar19 = fgets(local_438,0x400,pFVar13);
        } while (local_438 == pcVar19);
      }
      printf(" %d breakpoints in %s\n",(ulong)local_520,local_518);
      uVar6 = local_520;
      lVar20 = (long)(int)local_520;
      if (lVar20 < 0) {
        pcVar19 = "malloc tab_dist of REF_DBL negative";
        uVar16 = 0x1e2;
        goto LAB_001205d6;
      }
      sVar1 = lVar20 * 8;
      local_519 = cVar21;
      pRVar11 = (REF_DBL *)malloc(sVar1);
      if (pRVar11 == (REF_DBL *)0x0) {
        pcVar19 = "malloc tab_dist of REF_DBL NULL";
        uVar16 = 0x1e2;
        goto LAB_00120682;
      }
      if (uVar6 == 0) {
        local_518 = (REF_DBL *)malloc(sVar1);
        if (local_518 != (REF_DBL *)0x0) {
          pRVar12 = (REF_DBL *)malloc(sVar1);
          if (pRVar12 == (REF_DBL *)0x0) goto LAB_0012061b;
          goto LAB_00120553;
        }
      }
      else {
        memset(pRVar11,0,sVar1);
        local_518 = (REF_DBL *)calloc(1,sVar1);
        if (local_518 != (REF_DBL *)0x0) {
          pRVar12 = (REF_DBL *)malloc(sVar1);
          auVar3 = _DAT_00221120;
          if (pRVar12 == (REF_DBL *)0x0) {
LAB_0012061b:
            pcVar19 = "malloc tab_ar of REF_DBL NULL";
            uVar16 = 0x1e4;
            goto LAB_00120682;
          }
          lVar20 = lVar20 + -1;
          auVar25._8_4_ = (int)lVar20;
          auVar25._0_8_ = lVar20;
          auVar25._12_4_ = (int)((ulong)lVar20 >> 0x20);
          lVar20 = 0;
          auVar25 = auVar25 ^ _DAT_00221120;
          auVar29 = _DAT_00221110;
          do {
            bVar2 = auVar25._0_4_ < SUB164(auVar29 ^ auVar3,0);
            iVar9 = auVar25._4_4_;
            iVar34 = SUB164(auVar29 ^ auVar3,4);
            if ((bool)(~(iVar9 < iVar34 || iVar34 == iVar9 && bVar2) & 1)) {
              pcVar19 = (char *)((long)pRVar12 + lVar20);
              pcVar19[0] = '\0';
              pcVar19[1] = '\0';
              pcVar19[2] = '\0';
              pcVar19[3] = '\0';
              pcVar19[4] = '\0';
              pcVar19[5] = '\0';
              pcVar19[6] = -0x10;
              pcVar19[7] = '?';
            }
            if (iVar9 >= iVar34 && (iVar34 != iVar9 || !bVar2)) {
              pcVar19 = (char *)((long)pRVar12 + lVar20 + 8);
              pcVar19[0] = '\0';
              pcVar19[1] = '\0';
              pcVar19[2] = '\0';
              pcVar19[3] = '\0';
              pcVar19[4] = '\0';
              pcVar19[5] = '\0';
              pcVar19[6] = -0x10;
              pcVar19[7] = '?';
            }
            lVar22 = auVar29._8_8_;
            auVar29._0_8_ = auVar29._0_8_ + 2;
            auVar29._8_8_ = lVar22 + 2;
            lVar20 = lVar20 + 0x10;
          } while ((ulong)(uVar6 + 1 >> 1) << 4 != lVar20);
LAB_00120553:
          local_510 = pRVar12;
          iVar9 = fseek(pFVar13,0,0);
          if (iVar9 != 0) {
            pcVar19 = "rewind";
            uVar16 = 0x1e5;
            goto LAB_001205d6;
          }
          local_4c4 = local_520;
          local_520 = 0;
          local_4e8 = pFVar13;
          pcVar19 = fgets(local_438,0x400,pFVar13);
          if ((local_438 == pcVar19) && ((int)local_520 < (int)local_4c4)) {
            do {
              pcVar19 = strtok(local_438," ");
              if (pcVar19 != (char *)0x0) {
                iVar9 = 0;
                do {
                  pRVar12 = pRVar11;
                  if (((iVar9 == 0) || (pRVar12 = local_510, iVar9 == 2)) ||
                     (pRVar12 = local_518, iVar9 == 1)) {
                    dVar23 = atof(pcVar19);
                    pRVar12[(int)local_520] = dVar23;
                  }
                  iVar9 = iVar9 + 1;
                  pcVar19 = strtok((char *)0x0," ");
                } while (pcVar19 != (char *)0x0);
                if (iVar9 != 1) {
                  lVar20 = (long)(int)local_520;
                  printf(" %f %f %f %d\n",pRVar11[lVar20],local_518[lVar20],local_510[lVar20]);
                  local_520 = local_520 + 1;
                }
              }
              pcVar19 = fgets(local_438,0x400,local_4e8);
            } while ((local_438 == pcVar19) && ((int)local_520 < (int)local_4c4));
          }
          fclose(local_4e8);
          pRVar18 = local_500;
          uVar6 = ref_mpi_bcast(local_500,&local_520,1,1);
          if (uVar6 != 0) {
            pcVar19 = "n_tab";
            uVar16 = 0x1f9;
            goto LAB_0011fdd3;
          }
          if ((int)local_520 < 3) {
            pcVar19 = "table requires 2 entries";
            uVar16 = 0x1fa;
            goto LAB_001205d6;
          }
          uVar6 = ref_mpi_bcast(pRVar18,pRVar11,local_520,3);
          if (uVar6 != 0) {
            pcVar19 = "n_tab";
            uVar16 = 0x1fc;
            goto LAB_0011fdd3;
          }
          uVar6 = ref_mpi_bcast(pRVar18,local_518,local_520,3);
          pRVar18 = local_500;
          if (uVar6 != 0) {
            pcVar19 = "n_tab";
            uVar16 = 0x1fd;
            goto LAB_0011fdd3;
          }
          uVar6 = ref_mpi_bcast(local_500,local_510,local_520,3);
          pRVar12 = local_518;
          if (uVar6 != 0) {
            pcVar19 = "n_tab";
            uVar16 = 0x1fe;
            goto LAB_0011fdd3;
          }
          goto LAB_001210df;
        }
      }
      pcVar19 = "malloc tab_h of REF_DBL NULL";
      uVar16 = 0x1e3;
      goto LAB_00120682;
    }
    local_519 = cVar21;
    uVar6 = ref_mpi_bcast(local_500,&local_520,1,1);
    uVar7 = local_520;
    if (uVar6 != 0) {
      pcVar19 = "n_tab";
      uVar16 = 0x200;
      goto LAB_0011fdd3;
    }
    lVar20 = (long)(int)local_520;
    if (lVar20 < 3) {
      pcVar19 = "table requires 2 entries";
      uVar16 = 0x201;
      goto LAB_001205d6;
    }
    sVar1 = lVar20 * 8;
    pRVar11 = (REF_DBL *)calloc(1,sVar1);
    if (pRVar11 == (REF_DBL *)0x0) {
      pcVar19 = "malloc tab_dist of REF_DBL NULL";
      uVar16 = 0x202;
      goto LAB_00120682;
    }
    local_518 = (REF_DBL *)calloc(1,sVar1);
    if (local_518 == (REF_DBL *)0x0) {
      pcVar19 = "malloc tab_h of REF_DBL NULL";
      uVar16 = 0x203;
      goto LAB_00120682;
    }
    pRVar12 = (REF_DBL *)malloc(sVar1);
    pRVar18 = local_500;
    auVar3 = _DAT_00221120;
    if (pRVar12 == (REF_DBL *)0x0) {
      pcVar19 = "malloc tab_ar of REF_DBL NULL";
      uVar16 = 0x204;
      goto LAB_00120682;
    }
    lVar20 = lVar20 + -1;
    auVar26._8_4_ = (int)lVar20;
    auVar26._0_8_ = lVar20;
    auVar26._12_4_ = (int)((ulong)lVar20 >> 0x20);
    lVar20 = 0;
    auVar26 = auVar26 ^ _DAT_00221120;
    auVar30 = _DAT_00221110;
    do {
      bVar2 = auVar26._0_4_ < SUB164(auVar30 ^ auVar3,0);
      iVar9 = auVar26._4_4_;
      iVar34 = SUB164(auVar30 ^ auVar3,4);
      if ((bool)(~(iVar9 < iVar34 || iVar34 == iVar9 && bVar2) & 1)) {
        pcVar19 = (char *)((long)pRVar12 + lVar20);
        pcVar19[0] = '\0';
        pcVar19[1] = '\0';
        pcVar19[2] = '\0';
        pcVar19[3] = '\0';
        pcVar19[4] = '\0';
        pcVar19[5] = '\0';
        pcVar19[6] = -0x10;
        pcVar19[7] = '?';
      }
      if (iVar9 >= iVar34 && (iVar34 != iVar9 || !bVar2)) {
        pcVar19 = (char *)((long)pRVar12 + lVar20 + 8);
        pcVar19[0] = '\0';
        pcVar19[1] = '\0';
        pcVar19[2] = '\0';
        pcVar19[3] = '\0';
        pcVar19[4] = '\0';
        pcVar19[5] = '\0';
        pcVar19[6] = -0x10;
        pcVar19[7] = '?';
      }
      lVar22 = auVar30._8_8_;
      auVar30._0_8_ = auVar30._0_8_ + 2;
      auVar30._8_8_ = lVar22 + 2;
      lVar20 = lVar20 + 0x10;
    } while ((ulong)(uVar7 + 1 >> 1) << 4 != lVar20);
    local_510 = pRVar12;
    uVar6 = ref_mpi_bcast(local_500,pRVar11,uVar7,3);
    pRVar12 = local_518;
    if (uVar6 != 0) {
      pcVar19 = "n_tab";
      uVar16 = 0x206;
      goto LAB_0011fdd3;
    }
    uVar6 = ref_mpi_bcast(pRVar18,local_518,local_520,3);
    if (uVar6 != 0) {
      pcVar19 = "n_tab";
      uVar16 = 0x207;
      goto LAB_0011fdd3;
    }
    uVar6 = ref_mpi_bcast(pRVar18,local_510,local_520,3);
    if (uVar6 != 0) {
      pcVar19 = "n_tab";
      uVar16 = 0x208;
      goto LAB_0011fdd3;
    }
LAB_001210df:
    iVar9 = 1;
    pRVar15 = local_510;
    cVar21 = local_519;
  }
  if ((int)local_4f8 == iVar9) {
    pcVar19 = "set one and only one of --stepexp and --spacing-table";
    uVar16 = 0x20e;
  }
  else {
    if (-1 < (long)local_4c0->max) {
      local_510 = pRVar15;
      distance = (REF_DICT)malloc((long)local_4c0->max << 3);
      if (distance == (REF_DICT)0x0) {
        pcVar19 = "malloc distance of REF_DBL NULL";
        uVar16 = 0x210;
LAB_00120682:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
               ,uVar16,"distance_metric_fill",pcVar19);
        return 2;
      }
      local_519 = cVar21;
      local_4f8 = pRVar11;
      uVar6 = ref_phys_wall_distance(ref_grid,local_4f0,(REF_DBL *)distance);
      if (uVar6 == 0) {
        local_4f0 = distance;
        ref_mpi_stopwatch_stop(pRVar18,"wall distance");
        uVar6 = ref_grid->node->max;
        if ((int)uVar6 < 0) {
          pcVar19 = "malloc grad_dist of REF_DBL negative";
          uVar16 = 0x214;
          goto LAB_001205d6;
        }
        pFVar13 = (FILE *)malloc((ulong)uVar6 * 0x18);
        if (pFVar13 == (FILE *)0x0) {
          pcVar19 = "malloc grad_dist of REF_DBL NULL";
          uVar16 = 0x214;
          goto LAB_00120682;
        }
        uVar6 = ref_recon_gradient(ref_grid,(REF_DBL *)local_4f0,(REF_DBL *)pFVar13,
                                   REF_RECON_L2PROJECTION);
        if (uVar6 == 0) {
          pRVar15 = local_510;
          pRVar11 = local_4f8;
          local_518 = pRVar12;
          local_4e8 = pFVar13;
          if (iVar5 != -1) {
            pRVar14 = ref_grid->node;
            if ((double)local_478._0_8_ <= 0.0) {
              if (0 < pRVar14->max) {
                lVar20 = 0;
                do {
                  if (-1 < pRVar14->global[lVar20]) {
                    uVar6 = ref_metric_step_exp(*(REF_DBL *)(&local_4f0->n + lVar20 * 2),local_468,
                                                local_488,local_498,(REF_DBL)local_4a8._0_8_,
                                                (REF_DBL)local_4b8._0_8_,local_4d0,local_4d8);
                    if (uVar6 != 0) {
                      pcVar19 = "step exp";
                      uVar16 = 0x239;
                      goto LAB_0011fdd3;
                    }
                    local_420 = (char *)(1.0 / (local_468[0] * local_468[0]));
                    local_438._8_8_ = 0;
                    local_438._0_8_ = local_420;
                    local_428 = 0;
                    pcStack_418 = (char *)0x0;
                    local_410 = local_420;
                    if ((ref_grid->twod != 0) &&
                       (uVar6 = ref_matrix_twod_m((REF_DBL *)local_438), uVar6 != 0)) {
                      pcVar19 = "enforce 2d";
                      uVar16 = 0x240;
                      goto LAB_0011fdd3;
                    }
                    uVar6 = ref_node_metric_set(local_4c0,(REF_INT)lVar20,(REF_DBL *)local_438);
                    if (uVar6 != 0) {
                      pcVar19 = "set";
                      uVar16 = 0x241;
                      goto LAB_0011fdd3;
                    }
                    pRVar14 = ref_grid->node;
                    pRVar15 = local_510;
                    pRVar11 = local_4f8;
                  }
                  lVar20 = lVar20 + 1;
                } while (lVar20 < pRVar14->max);
              }
            }
            else if (0 < pRVar14->max) {
              ppcVar17 = &pFVar13->_IO_read_end;
              lVar20 = 0;
              do {
                if (-1 < pRVar14->global[lVar20]) {
                  uVar6 = ref_metric_step_exp(*(REF_DBL *)(&local_4f0->n + lVar20 * 2),
                                              (REF_DBL *)&local_4e0,local_488,local_498,
                                              (REF_DBL)local_4a8._0_8_,(REF_DBL)local_4b8._0_8_,
                                              local_4d0,local_4d8);
                  if (uVar6 != 0) {
                    pcVar19 = "step exp";
                    uVar16 = 0x21e;
                    goto LAB_0011fdd3;
                  }
                  dVar23 = (double)CONCAT44(local_4e0._4_4_,(uint)local_4e0);
                  auVar27._0_8_ = dVar23 * dVar23;
                  auVar27._8_8_ =
                       (double)local_478._0_8_ * dVar23 * (double)local_478._0_8_ * dVar23;
                  local_438 = divpd(_DAT_00221160,auVar27);
                  local_428 = local_438._8_8_;
                  local_420 = *(char **)(ppcVar17 + -2);
                  pcStack_418 = ppcVar17[-1];
                  local_410 = *ppcVar17;
                  RVar10 = ref_math_normalize((REF_DBL *)&local_420);
                  if (RVar10 == 0) {
                    uVar6 = ref_math_orthonormal_system((REF_DBL *)&local_420,local_408,local_3f0);
                    if (uVar6 != 0) {
                      pcVar19 = "ortho sys";
                      uVar16 = 0x227;
                      goto LAB_0011fdd3;
                    }
                    uVar6 = ref_matrix_form_m((REF_DBL *)local_438,local_468);
                    if (uVar6 != 0) {
                      pcVar19 = "form m from d";
                      uVar16 = 0x228;
                      goto LAB_0011fdd3;
                    }
                  }
                  else {
                    local_468[0] = 1.0 / ((double)CONCAT44(local_4e0._4_4_,(uint)local_4e0) *
                                         (double)CONCAT44(local_4e0._4_4_,(uint)local_4e0));
                    local_468[1] = 0.0;
                    local_468[2] = 0.0;
                    local_448 = 0;
                    local_468[3] = local_468[0];
                    local_440 = local_468[0];
                  }
                  if ((ref_grid->twod != 0) && (uVar6 = ref_matrix_twod_m(local_468), uVar6 != 0)) {
                    pcVar19 = "enforce 2d";
                    uVar16 = 0x231;
                    goto LAB_0011fdd3;
                  }
                  uVar6 = ref_node_metric_set(local_4c0,(REF_INT)lVar20,local_468);
                  if (uVar6 != 0) {
                    pcVar19 = "set";
                    uVar16 = 0x232;
                    goto LAB_0011fdd3;
                  }
                  pRVar14 = ref_grid->node;
                  pRVar15 = local_510;
                  pRVar11 = local_4f8;
                }
                lVar20 = lVar20 + 1;
                ppcVar17 = ppcVar17 + 3;
              } while (lVar20 < pRVar14->max);
            }
          }
          if (local_519 == '\0') {
            pRVar14 = ref_grid->node;
            pRVar12 = local_518;
            if (0 < pRVar14->max) {
              ppcVar17 = &local_4e8->_IO_read_end;
              lVar20 = 0;
              do {
                if (-1 < pRVar14->global[lVar20]) {
                  local_500 = *(REF_MPI *)(&local_4f0->n + lVar20 * 2);
                  uVar6 = ref_sort_search_dbl(local_520,pRVar11,(REF_DBL)local_500,
                                              (REF_INT *)&local_4e0);
                  if (uVar6 != 0) {
                    pcVar19 = "first index on range";
                    uVar16 = 0x24f;
                    goto LAB_0011fdd3;
                  }
                  lVar22 = (long)(int)(uint)local_4e0;
                  dVar28 = pRVar11[lVar22 + 1] - pRVar11[lVar22];
                  dVar32 = (double)local_500 - pRVar11[lVar22];
                  dVar23 = dVar28 * 1e+20;
                  dVar33 = (double)((ulong)dVar23 ^ (ulong)DAT_00221140);
                  if (dVar23 <= dVar33) {
                    dVar23 = dVar33;
                  }
                  dVar24 = (double)((ulong)dVar32 ^ (ulong)DAT_00221140);
                  dVar33 = dVar32;
                  if (dVar32 <= dVar24) {
                    dVar33 = dVar24;
                  }
                  dVar23 = (double)(-(ulong)(dVar33 < dVar23) & (ulong)(dVar32 / dVar28));
                  local_488 = 0.0;
                  if (0.0 <= dVar23) {
                    local_488 = dVar23;
                  }
                  if (1.0 <= local_488) {
                    local_488 = 1.0;
                  }
                  local_498 = 1.0 - local_488;
                  uStack_480 = 0;
                  uStack_490 = 0;
                  local_4a8._0_8_ =
                       local_510[lVar22] * local_498 + local_488 * local_510[lVar22 + 1];
                  local_4a8._8_8_ =
                       local_518[lVar22] * local_498 + local_488 * local_518[lVar22 + 1];
                  local_4b8._8_8_ = local_4a8._8_8_;
                  local_4b8._0_8_ = local_4a8._8_8_;
                  auVar31._0_8_ = (double)local_4a8._8_8_ * (double)local_4a8._8_8_;
                  auVar31._8_8_ =
                       (double)local_4a8._0_8_ * (double)local_4a8._8_8_ * (double)local_4a8._0_8_ *
                       (double)local_4a8._8_8_;
                  local_478 = divpd(_DAT_00221160,auVar31);
                  local_428 = local_478._8_8_;
                  local_420 = *(char **)(ppcVar17 + -2);
                  pcStack_418 = ppcVar17[-1];
                  local_410 = *ppcVar17;
                  local_438 = local_478;
                  RVar10 = ref_math_normalize((REF_DBL *)&local_420);
                  if (RVar10 == 0) {
                    uVar6 = ref_math_orthonormal_system((REF_DBL *)&local_420,local_408,local_3f0);
                    if (uVar6 != 0) {
                      pcVar19 = "ortho sys";
                      uVar16 = 0x262;
                      goto LAB_0011fdd3;
                    }
                    uVar6 = ref_matrix_form_m((REF_DBL *)local_438,local_468);
                    if (uVar6 != 0) {
                      pcVar19 = "form m from d";
                      uVar16 = 0x263;
                      goto LAB_0011fdd3;
                    }
                  }
                  else {
                    local_468[0] = local_478._0_8_;
                    local_468[1] = 0.0;
                    local_468[2] = 0.0;
                    local_448 = 0;
                    local_468[3] = local_468[0];
                    local_440 = local_468[0];
                  }
                  if ((ref_grid->twod != 0) && (uVar6 = ref_matrix_twod_m(local_468), uVar6 != 0)) {
                    pcVar19 = "enforce 2d";
                    uVar16 = 0x26c;
                    goto LAB_0011fdd3;
                  }
                  uVar6 = ref_node_metric_set(local_4c0,(REF_INT)lVar20,local_468);
                  if (uVar6 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c"
                           ,0x272,"distance_metric_fill",(ulong)uVar6,"set");
                    printf("dist %f h %f ar %f t0 %f t1 %f i0 %d i1 %d\n",local_500,
                           (ulong)(uint)local_4e0,lVar22 + 1U & 0xffffffff);
                    printf("tab_h[i0] %f tab_h[i1] %f tab_h[i0] %f tab_h[i1] %f\n",
                           local_4f8[(int)(uint)local_4e0],local_4f8[lVar22 + 1],
                           local_518[(int)(uint)local_4e0],local_518[lVar22 + 1]);
                    return uVar6;
                  }
                  pRVar14 = ref_grid->node;
                  pRVar15 = local_510;
                  pRVar11 = local_4f8;
                  pRVar12 = local_518;
                }
                lVar20 = lVar20 + 1;
                ppcVar17 = ppcVar17 + 3;
              } while (lVar20 < pRVar14->max);
            }
            if (pRVar15 != (REF_DBL *)0x0) {
              free(pRVar15);
            }
            if (pRVar12 != (REF_DBL *)0x0) {
              free(pRVar12);
            }
            if (pRVar11 != (REF_DBL *)0x0) {
              free(pRVar11);
            }
          }
          free(local_4e8);
          free(local_4f0);
          return 0;
        }
        pcVar19 = "grad dist";
        uVar16 = 0x215;
      }
      else {
        pcVar19 = "wall dist";
        uVar16 = 0x211;
      }
LAB_0011fdd3:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
             uVar16,"distance_metric_fill",(ulong)uVar6,pcVar19);
      return uVar6;
    }
    pcVar19 = "malloc distance of REF_DBL negative";
    uVar16 = 0x210;
  }
LAB_001205d6:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subcommand.c",
         uVar16,"distance_metric_fill",pcVar19);
  return 1;
}

Assistant:

static REF_STATUS distance_metric_fill(REF_GRID ref_grid, REF_DICT ref_dict_bcs,
                                       int argc, char *argv[]) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *distance;
  REF_INT node;
  REF_INT pos;
  REF_DBL h0 = 0.0, h1 = 0.0, h2 = 0.0, s1 = 0.0, s2 = 0.0, width = 0.0;
  REF_DBL aspect_ratio = 1.0;
  REF_BOOL have_stepexp = REF_FALSE;
  REF_BOOL have_spacing_table = REF_FALSE;
  REF_DBL *grad_dist;
  REF_RECON_RECONSTRUCTION recon = REF_RECON_L2PROJECTION;
  REF_INT n_tab = 0, max_tab;
  REF_DBL *tab_dist = NULL, *tab_h = NULL, *tab_ar = NULL;

  RXS(ref_args_find(argc, argv, "--aspect-ratio", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos && pos < argc - 1) {
    aspect_ratio = atof(argv[pos + 1]);
    aspect_ratio = MAX(1.0, aspect_ratio);
    if (ref_mpi_once(ref_mpi))
      printf("limit --aspect-ratio to %f for --stepexp\n", aspect_ratio);
  }

  RXS(ref_args_find(argc, argv, "--stepexp", &pos), REF_NOT_FOUND,
      "arg search");
  if (REF_EMPTY != pos) {
    have_stepexp = REF_TRUE;
    RAS(pos + 6 < argc, "not enough --stepexp args");
    h0 = atof(argv[pos + 1]);
    h1 = atof(argv[pos + 2]);
    h2 = atof(argv[pos + 3]);
    s1 = atof(argv[pos + 4]);
    s2 = atof(argv[pos + 5]);
    width = atof(argv[pos + 6]);
    if (ref_mpi_once(ref_mpi))
      printf("h0 %f h1 %f h2 %f s1 %f s2 %f width %f\n", h0, h1, h2, s1, s2,
             width);
    RAS(h0 > 0.0, "positive h0");
    RAS(h1 > 0.0, "positive h1");
    RAS(h2 > 0.0, "positive h2");
    RAS(s1 > 0.0, "positive s1");
    RAS(s2 > 0.0, "positive s2");
    RAS(width > 0.0, "positive width");
  }

  RXS(ref_args_find(argc, argv, "--spacing-table", &pos), REF_NOT_FOUND,
      "metric arg search");
  if (REF_EMPTY != pos && pos < argc - 1) {
    FILE *file = NULL;
    char line[1024];
    const char *filename = argv[pos + 1];
    const char *token;
    const char space[] = " ";
    REF_INT ncol;
    if (ref_mpi_once(ref_mpi)) {
      file = fopen(filename, "r");
      if (NULL == (void *)file) printf("unable to open %s\n", filename);
      RNS(file, "unable to open file");
      n_tab = 0;
      while (line == fgets(line, 1024, file)) {
        ncol = 0;
        token = strtok(line, space);
        while (token != NULL) {
          ncol++;
          token = strtok(NULL, space);
        }
        if (ncol >= 2) n_tab++;
      }
      printf(" %d breakpoints in %s\n", n_tab, filename);
      ref_malloc_init(tab_dist, n_tab, REF_DBL, 0.0);
      ref_malloc_init(tab_h, n_tab, REF_DBL, 0.0);
      ref_malloc_init(tab_ar, n_tab, REF_DBL, 1.0);
      RAS(0 == fseek(file, 0, SEEK_SET), "rewind");
      max_tab = n_tab;
      n_tab = 0;
      while (line == fgets(line, 1024, file) && n_tab < max_tab) {
        ncol = 0;
        token = strtok(line, space);
        while (token != NULL) {
          if (0 == ncol) tab_dist[n_tab] = atof(token);
          if (1 == ncol) tab_h[n_tab] = atof(token);
          if (2 == ncol) tab_ar[n_tab] = atof(token);
          ncol++;
          token = strtok(NULL, space);
        }
        if (ncol >= 2) {
          printf(" %f %f %f %d\n", tab_dist[n_tab], tab_h[n_tab], tab_ar[n_tab],
                 n_tab);
          n_tab++;
        }
      }
      fclose(file);
      RSS(ref_mpi_bcast(ref_mpi, (void *)&n_tab, 1, REF_INT_TYPE), "n_tab");
      RAS(n_tab > 2, "table requires 2 entries");
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_dist, n_tab, REF_DBL_TYPE),
          "n_tab");
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_h, n_tab, REF_DBL_TYPE), "n_tab");
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_ar, n_tab, REF_DBL_TYPE), "n_tab");
    } else {
      RSS(ref_mpi_bcast(ref_mpi, (void *)&n_tab, 1, REF_INT_TYPE), "n_tab");
      RAS(n_tab > 2, "table requires 2 entries");
      ref_malloc_init(tab_dist, n_tab, REF_DBL, 0.0);
      ref_malloc_init(tab_h, n_tab, REF_DBL, 0.0);
      ref_malloc_init(tab_ar, n_tab, REF_DBL, 1.0);
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_dist, n_tab, REF_DBL_TYPE),
          "n_tab");
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_h, n_tab, REF_DBL_TYPE), "n_tab");
      RSS(ref_mpi_bcast(ref_mpi, (void *)tab_ar, n_tab, REF_DBL_TYPE), "n_tab");
    }
    have_spacing_table = REF_TRUE;
  }

  RAS(have_stepexp != have_spacing_table,
      "set one and only one of --stepexp and --spacing-table");

  ref_malloc(distance, ref_node_max(ref_node), REF_DBL);
  RSS(ref_phys_wall_distance(ref_grid, ref_dict_bcs, distance), "wall dist");
  ref_mpi_stopwatch_stop(ref_mpi, "wall distance");

  ref_malloc(grad_dist, 3 * ref_node_max(ref_grid_node(ref_grid)), REF_DBL);
  RSS(ref_recon_gradient(ref_grid, distance, grad_dist, recon), "grad dist");

  if (have_stepexp) {
    if (aspect_ratio > 0.0) {
      each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
        REF_DBL m[6];
        REF_DBL d[12];
        REF_DBL h;
        REF_DBL s = distance[node];
        RSS(ref_metric_step_exp(s, &h, h0, h1, h2, s1, s2, width), "step exp");
        ref_matrix_eig(d, 0) = 1.0 / (h * h);
        ref_matrix_eig(d, 1) = 1.0 / (aspect_ratio * h * aspect_ratio * h);
        ref_matrix_eig(d, 2) = 1.0 / (aspect_ratio * h * aspect_ratio * h);
        ref_matrix_vec(d, 0, 0) = grad_dist[0 + 3 * node];
        ref_matrix_vec(d, 1, 0) = grad_dist[1 + 3 * node];
        ref_matrix_vec(d, 2, 0) = grad_dist[2 + 3 * node];
        if (REF_SUCCESS == ref_math_normalize(&(d[3]))) {
          RSS(ref_math_orthonormal_system(&(d[3]), &(d[6]), &(d[9])),
              "ortho sys");
          RSS(ref_matrix_form_m(d, m), "form m from d");
        } else {
          m[0] = 1.0 / (h * h);
          m[1] = 0.0;
          m[2] = 0.0;
          m[3] = 1.0 / (h * h);
          m[4] = 0.0;
          m[5] = 1.0 / (h * h);
        }
        if (ref_grid_twod(ref_grid)) RSS(ref_matrix_twod_m(m), "enforce 2d");
        RSS(ref_node_metric_set(ref_node, node, m), "set");
      }
    } else {
      each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
        REF_DBL m[6];
        REF_DBL h;
        REF_DBL s = distance[node];
        RSS(ref_metric_step_exp(s, &h, h0, h1, h2, s1, s2, width), "step exp");
        m[0] = 1.0 / (h * h);
        m[1] = 0.0;
        m[2] = 0.0;
        m[3] = 1.0 / (h * h);
        m[4] = 0.0;
        m[5] = 1.0 / (h * h);
        if (ref_grid_twod(ref_grid)) RSS(ref_matrix_twod_m(m), "enforce 2d");
        RSS(ref_node_metric_set(ref_node, node, m), "set");
      }
    }
  }

  if (have_spacing_table) {
    each_ref_node_valid_node(ref_grid_node(ref_grid), node) {
      REF_DBL m[6];
      REF_DBL d[12];
      REF_DBL h;
      REF_DBL dist = distance[node];
      REF_INT i0, i1;
      REF_DBL t0, t1;
      RSS(ref_sort_search_dbl(n_tab, tab_dist, dist, &i0),
          "first index on range");
      i1 = i0 + 1;
      t1 = 0.0;
      if (ref_math_divisible((dist - tab_dist[i0]),
                             (tab_dist[i1] - tab_dist[i0]))) {
        t1 = (dist - tab_dist[i0]) / (tab_dist[i1] - tab_dist[i0]);
      }
      t1 = MIN(MAX(0.0, t1), 1.0);
      t0 = 1.0 - t1;
      h = t0 * tab_h[i0] + t1 * tab_h[i1];
      aspect_ratio = t0 * tab_ar[i0] + t1 * tab_ar[i1];
      ref_matrix_eig(d, 0) = 1.0 / (h * h);
      ref_matrix_eig(d, 1) = 1.0 / (aspect_ratio * h * aspect_ratio * h);
      ref_matrix_eig(d, 2) = 1.0 / (aspect_ratio * h * aspect_ratio * h);
      ref_matrix_vec(d, 0, 0) = grad_dist[0 + 3 * node];
      ref_matrix_vec(d, 1, 0) = grad_dist[1 + 3 * node];
      ref_matrix_vec(d, 2, 0) = grad_dist[2 + 3 * node];
      if (REF_SUCCESS == ref_math_normalize(&(d[3]))) {
        RSS(ref_math_orthonormal_system(&(d[3]), &(d[6]), &(d[9])),
            "ortho sys");
        RSS(ref_matrix_form_m(d, m), "form m from d");
      } else {
        m[0] = 1.0 / (h * h);
        m[1] = 0.0;
        m[2] = 0.0;
        m[3] = 1.0 / (h * h);
        m[4] = 0.0;
        m[5] = 1.0 / (h * h);
      }
      if (ref_grid_twod(ref_grid)) RSS(ref_matrix_twod_m(m), "enforce 2d");
      RSB(ref_node_metric_set(ref_node, node, m), "set", {
        printf("dist %f h %f ar %f t0 %f t1 %f i0 %d i1 %d\n", dist, h,
               aspect_ratio, t0, t1, i0, i1);
        printf("tab_h[i0] %f tab_h[i1] %f tab_h[i0] %f tab_h[i1] %f\n",
               tab_dist[i0], tab_dist[i1], tab_h[i0], tab_h[i1]);
      });
    }

    ref_free(tab_ar);
    ref_free(tab_h);
    ref_free(tab_dist);
  }

  ref_free(grad_dist);
  ref_free(distance);
  return REF_SUCCESS;
}